

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_block_tests.cpp
# Opt level: O3

void __thiscall validation_block_tests::mempool_locks_reorg::test_method(mempool_locks_reorg *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  long lVar1;
  uint256 *puVar2;
  element_type *peVar3;
  undefined1 auVar4 [16];
  pointer psVar5;
  pointer psVar6;
  undefined8 uVar7;
  readonly_property65 rVar8;
  bool bVar9;
  uint uVar10;
  CChainParams *pCVar11;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar12;
  Chainstate *pCVar13;
  long lVar14;
  pointer psVar15;
  iterator in_R8;
  iterator pvVar16;
  bool *new_block;
  iterator in_R9;
  iterator pvVar17;
  uint uVar18;
  CTransactionRef *tx;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar23;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  shared_ptr<const_CBlock> local_400;
  thread rpc_thread;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_> reorg;
  char *local_378;
  char *local_370;
  shared_ptr<const_CBlock> local_368;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  shared_ptr<const_CBlock> local_328;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  txs;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  shared_ptr<const_CBlock> local_2a8;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  undefined1 local_278 [16];
  _Head_base<0UL,_kernel::Context_*,_false> local_268;
  __uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_> local_260;
  shared_ptr<const_CBlock> local_258;
  _Head_base<0UL,_AddrMan_*,_false> local_248;
  __uniq_ptr_impl<CConnman,_std::default_delete<CConnman>_> local_240;
  _Head_base<0UL,_CTxMemPool_*,_false> local_238;
  __uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_> local_230;
  bool ignored;
  __uniq_ptr_impl<PeerManager,_std::default_delete<PeerManager>_> local_220;
  undefined1 local_218 [8];
  undefined1 local_210 [16];
  undefined1 local_200 [24];
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_1e8;
  undefined8 uStack_1d0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  shared_count sStack_1b8;
  undefined1 auStack_1b0 [8];
  CMutableTransaction mtx;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_158 [3];
  _Storage<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false>
  local_110;
  bool local_f8;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_c8;
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_b0;
  undefined1 local_98 [16];
  shared_count local_88 [2];
  uint256 tip_init;
  uint256 split_hash;
  
  split_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       split_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_238._M_head_impl = (CTxMemPool *)0xf7c21b;
  local_230._M_t.
  super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>.
  super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl =
       (tuple<const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>)
       ((long)
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
       + 0x68);
  local_248._M_head_impl = (AddrMan *)&boost::unit_test::basic_cstring<char_const>::null;
  local_240._M_t.super__Tuple_impl<0UL,_CConnman_*,_std::default_delete<CConnman>_>.
  super__Head_base<0UL,_CConnman_*,_false>._M_head_impl =
       (tuple<CConnman_*,_std::default_delete<CConnman>_>)
       &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xea;
  file.m_begin = (iterator)&local_238;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_248,msg);
  pCVar11 = Params();
  split_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CBlock,std::allocator<CBlock>,CBlock_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (split_hash.super_base_blob<256U>.m_data._M_elems + 8),(CBlock **)&split_hash,
             (allocator<CBlock> *)&mtx,&pCVar11->genesis);
  local_258.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)split_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
  local_258.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       split_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
  split_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  split_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  val = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.super_TestingSetup.
         super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman;
  puVar12 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                      (val,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
                       ,0xe6,"operator()","m_node.chainman");
  _cVar23 = 0x7533d9;
  rVar8.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       ChainstateManager::ProcessNewBlock
                 ((puVar12->_M_t).
                  super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                  .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&local_258,true,
                  true,&ignored);
  local_c8._M_head_impl._0_1_ = rVar8.super_readonly_property<bool>.super_class_property<bool>.value
  ;
  sStack_c0.px = (element_type *)0x0;
  sStack_c0.pn.pi_ = (sp_counted_base *)0x0;
  mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&tip_init;
  tip_init.super_base_blob<256U>.m_data._M_elems[0] = 0xf2;
  tip_init.super_base_blob<256U>.m_data._M_elems[1] = 0xc4;
  tip_init.super_base_blob<256U>.m_data._M_elems[2] = 0xf7;
  tip_init.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[8] = '1';
  tip_init.super_base_blob<256U>.m_data._M_elems[9] = 0xc5;
  tip_init.super_base_blob<256U>.m_data._M_elems[10] = 0xf7;
  tip_init.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  tip_init.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013ae1c8;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_268._M_head_impl = (Context *)0xf7c21b;
  local_260._M_t.super__Tuple_impl<0UL,_ECC_Context_*,_std::default_delete<ECC_Context>_>.
  super__Head_base<0UL,_ECC_Context_*,_false>._M_head_impl =
       (tuple<ECC_Context_*,_std::default_delete<ECC_Context>_>)
       ((long)
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
       + 0x68);
  pvVar16 = (iterator)0x2;
  pvVar17 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_c8,(lazy_ostream *)&mtx,2,0,WARN,_cVar23,(size_t)&local_268,
             0xea);
  boost::detail::shared_count::~shared_count(&sStack_c0.pn);
  if (local_258.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (split_hash.super_base_blob<256U>.m_data._M_elems._8_8_ != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               split_hash.super_base_blob<256U>.m_data._M_elems._8_8_);
  }
  pCVar11 = Params();
  CBlockHeader::GetHash((uint256 *)&mtx,&(pCVar11->genesis).super_CBlockHeader);
  MinerTestingSetup::GoodBlock((MinerTestingSetup *)local_278,(uint256 *)this);
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xec;
  file_00.m_begin = (iterator)&local_288;
  msg_00.m_end = pvVar17;
  msg_00.m_begin = pvVar16;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_298,
             msg_00);
  local_2a8.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_278._0_8_;
  local_2a8.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_;
  if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_278._8_8_ + 8) = *(_Atomic_word *)(local_278._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_278._8_8_ + 8) = *(_Atomic_word *)(local_278._8_8_ + 8) + 1;
    }
  }
  puVar12 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                      (val,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
                       ,0xe6,"operator()","m_node.chainman");
  _cVar23 = 0x753577;
  bVar9 = ChainstateManager::ProcessNewBlock
                    ((puVar12->_M_t).
                     super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                     .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&local_2a8,true
                     ,true,&ignored);
  local_c8._M_head_impl._0_1_ = (readonly_property<bool>)(readonly_property<bool>)bVar9;
  sStack_c0.px = (element_type *)0x0;
  sStack_c0.pn.pi_ = (sp_counted_base *)0x0;
  split_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = "";
  split_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = "ProcessBlock(last_mined)";
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)&PTR__lazy_ostream_013ae1c8;
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
  ;
  local_2b0 = "";
  pvVar16 = (iterator)0x2;
  pvVar17 = (iterator)0x0;
  mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&split_hash;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_c8,(lazy_ostream *)&mtx,2,0,WARN,_cVar23,(size_t)&local_2b8,
             0xec);
  boost::detail::shared_count::~shared_count(&sStack_c0.pn);
  if ((element_type *)
      local_2a8.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2a8.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  uVar10 = 3;
  while( true ) {
    local_2c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
    ;
    local_2c0 = "";
    local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0xf0;
    file_01.m_begin = (iterator)&local_2c8;
    msg_01.m_end = pvVar17;
    msg_01.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2d8,
               msg_01);
    split_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    split_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_013ae088;
    split_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
    split_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    CBlockHeader::GetHash(&tip_init,(CBlockHeader *)local_278._0_8_);
    inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
              (val,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
               ,0xf0,"test_method","m_node.chainman");
    inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
              (val,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
               ,0xf0,"operator()","m_node.chainman");
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&cs_main;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_1_ = 0;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&mtx);
    pCVar13 = ChainstateManager::ActiveChainstate
                        ((val->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    puVar2 = (pCVar13->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]->phashBlock;
    if (puVar2 == (uint256 *)0x0) break;
    local_98._0_8_ = *(undefined8 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
    unique0x100010e7 = *(undefined1 (*) [16])((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
    local_88[1].pi_ = *(sp_counted_base **)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
    std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&mtx);
    auVar21[0] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0x10] == local_88[0].pi_._0_1_);
    auVar21[1] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0x11] == local_88[0].pi_._1_1_);
    auVar21[2] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0x12] == local_88[0].pi_._2_1_);
    auVar21[3] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0x13] == local_88[0].pi_._3_1_);
    auVar21[4] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0x14] == local_88[0].pi_._4_1_);
    auVar21[5] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0x15] == local_88[0].pi_._5_1_);
    auVar21[6] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0x16] == local_88[0].pi_._6_1_);
    auVar21[7] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0x17] == local_88[0].pi_._7_1_);
    auVar21[8] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0x18] == local_88[1].pi_._0_1_);
    auVar21[9] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0x19] == local_88[1].pi_._1_1_);
    auVar21[10] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0x1a] == local_88[1].pi_._2_1_);
    auVar21[0xb] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0x1b] == local_88[1].pi_._3_1_);
    auVar21[0xc] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0x1c] == local_88[1].pi_._4_1_);
    auVar21[0xd] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0x1d] == local_88[1].pi_._5_1_);
    auVar21[0xe] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0x1e] == local_88[1].pi_._6_1_);
    auVar21[0xf] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0x1f] == local_88[1].pi_._7_1_);
    auVar19[0] = -((readonly_property<bool>)tip_init.super_base_blob<256U>.m_data._M_elems[0] ==
                  local_98[0]);
    auVar19[1] = -(tip_init.super_base_blob<256U>.m_data._M_elems[1] == local_98[1]);
    auVar19[2] = -(tip_init.super_base_blob<256U>.m_data._M_elems[2] == local_98[2]);
    auVar19[3] = -(tip_init.super_base_blob<256U>.m_data._M_elems[3] == local_98[3]);
    auVar19[4] = -(tip_init.super_base_blob<256U>.m_data._M_elems[4] == local_98[4]);
    auVar19[5] = -(tip_init.super_base_blob<256U>.m_data._M_elems[5] == local_98[5]);
    auVar19[6] = -(tip_init.super_base_blob<256U>.m_data._M_elems[6] == local_98[6]);
    auVar19[7] = -(tip_init.super_base_blob<256U>.m_data._M_elems[7] == local_98[7]);
    auVar19[8] = -(tip_init.super_base_blob<256U>.m_data._M_elems[8] == local_98[8]);
    auVar19[9] = -(tip_init.super_base_blob<256U>.m_data._M_elems[9] == local_98[9]);
    auVar19[10] = -(tip_init.super_base_blob<256U>.m_data._M_elems[10] == local_98[10]);
    auVar19[0xb] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0xb] == local_98[0xb]);
    auVar19[0xc] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0xc] == local_98[0xc]);
    auVar19[0xd] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0xd] == local_98[0xd]);
    auVar19[0xe] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0xe] == local_98[0xe]);
    auVar19[0xf] = -(tip_init.super_base_blob<256U>.m_data._M_elems[0xf] == local_98[0xf]);
    auVar19 = auVar19 & auVar21;
    criticalblock17.super_unique_lock._M_device =
         (mutex_type *)
         CONCAT71(criticalblock17.super_unique_lock._M_device._1_7_,
                  (ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff);
    criticalblock17.super_unique_lock._8_8_ = (element_type *)0x0;
    sStack_1b8.pi_ = (sp_counted_base *)0x0;
    local_1e8.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0xf7c21b;
    local_1e8.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf7c283;
    local_200._0_8_ = &tip_init;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_1_ = 0;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_013aed38;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_200;
    txs.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_98;
    sStack_c0.px = (element_type *)(sStack_c0._1_8_ << 8);
    local_c8._M_head_impl = (_Impl *)&PTR__lazy_ostream_013aed38;
    sStack_c0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    aStack_b0._M_allocated_capacity = (size_type)&txs;
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&criticalblock17,(lazy_ostream *)&split_hash,1,2,REQUIRE,0xf7c54b
               ,(size_t)&local_1e8,0xf0,&mtx,
               "(MaybeCheckNotHeld(inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\", 240, __func__, \"m_node.chainman\")->GetMutex()), [&]() -> decltype(auto) { UniqueLock criticalblock16(MaybeCheckNotHeld(inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\", 240, __func__, \"m_node.chainman\")->GetMutex()), \"inline_assertion_check<true>(m_node.chainman, \\\"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\\\", 240, __func__, \\\"m_node.chainman\\\")->GetMutex()\", \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\", 240); return m_node.chainman->ActiveChain().Tip()->GetBlockHash(); }())"
               ,(COutPoint *)&local_c8);
    boost::detail::shared_count::~shared_count(&sStack_1b8);
    split_hash.super_base_blob<256U>.m_data._M_elems._0_16_ =
         *(undefined1 (*) [16])
          (((CBlockHeader *)local_278._0_8_)->hashPrevBlock).super_base_blob<256U>.m_data._M_elems;
    split_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
         *(undefined8 *)
          ((((CBlockHeader *)local_278._0_8_)->hashPrevBlock).super_base_blob<256U>.m_data._M_elems
          + 0x10);
    split_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)
          ((((CBlockHeader *)local_278._0_8_)->hashPrevBlock).super_base_blob<256U>.m_data._M_elems
          + 0x18);
    txs.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    txs.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    txs.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar18 = 0x17;
    do {
      CMutableTransaction::CMutableTransaction(&mtx);
      lVar14 = *(long *)&((((CScriptWitness *)(local_278._0_8_ + 0x50))->stack).
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
      local_c8._M_head_impl =
           *(_Impl **)
            &((__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
               *)(lVar14 + 0x39))->
             super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ;
      sStack_c0 = *(shared_ptr<boost::basic_wrap_stringstream<char>_> *)(lVar14 + 0x41);
      aStack_b0._M_allocated_capacity = *(size_type *)(lVar14 + 0x51);
      aStack_b0._8_4_ = 1;
      tip_init.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint,CScript>
                ((vector<CTxIn,std::allocator<CTxIn>> *)&mtx,(COutPoint *)&local_c8,
                 (CScript *)&tip_init);
      if (0x1c < CONCAT13(tip_init.super_base_blob<256U>.m_data._M_elems[0x1f],
                          CONCAT12(tip_init.super_base_blob<256U>.m_data._M_elems[0x1e],
                                   CONCAT11(tip_init.super_base_blob<256U>.m_data._M_elems[0x1d],
                                            tip_init.super_base_blob<256U>.m_data._M_elems[0x1c]))))
      {
        free((void *)CONCAT17(tip_init.super_base_blob<256U>.m_data._M_elems[7],
                              CONCAT16(tip_init.super_base_blob<256U>.m_data._M_elems[6],
                                       CONCAT15(tip_init.super_base_blob<256U>.m_data._M_elems[5],
                                                CONCAT14(tip_init.super_base_blob<256U>.m_data.
                                                         _M_elems[4],
                                                         CONCAT13(tip_init.super_base_blob<256U>.
                                                                  m_data._M_elems[3],
                                                                  CONCAT12(tip_init.
                                                  super_base_blob<256U>.m_data._M_elems[2],
                                                  CONCAT11(tip_init.super_base_blob<256U>.m_data.
                                                           _M_elems[1],
                                                           tip_init.super_base_blob<256U>.m_data.
                                                           _M_elems[0]))))))));
      }
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::push_back(&((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start)->scriptWitness).stack,
                  &WITNESS_STACK_ELEM_OP_TRUE);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::push_back
                (&mtx.vout,
                 (value_type *)
                 (*(long *)(*(long *)&((((CScriptWitness *)(local_278._0_8_ + 0x50))->stack).
                                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                           + 0x18) + 0x28));
      (mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start)->nValue =
           (mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
            super__Vector_impl_data._M_start)->nValue + -1000;
      local_c8._M_head_impl = (_Impl *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sStack_c0,(CTransaction **)&local_c8
                 ,(allocator<CTransaction> *)&tip_init,&mtx);
      std::
      vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
      ::emplace_back<std::shared_ptr<CTransaction_const>>
                ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                  *)&txs,(shared_ptr<const_CTransaction> *)&local_c8);
      if (sStack_c0.px != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sStack_c0.px);
      }
      CBlockHeader::GetHash((uint256 *)&local_c8,(CBlockHeader *)local_278._0_8_);
      MinerTestingSetup::GoodBlock((MinerTestingSetup *)&tip_init,(uint256 *)this);
      uVar7 = local_278._8_8_;
      local_278._0_8_ =
           CONCAT17(tip_init.super_base_blob<256U>.m_data._M_elems[7],
                    CONCAT16(tip_init.super_base_blob<256U>.m_data._M_elems[6],
                             CONCAT15(tip_init.super_base_blob<256U>.m_data._M_elems[5],
                                      CONCAT14(tip_init.super_base_blob<256U>.m_data._M_elems[4],
                                               CONCAT13(tip_init.super_base_blob<256U>.m_data.
                                                        _M_elems[3],
                                                        CONCAT12(tip_init.super_base_blob<256U>.
                                                                 m_data._M_elems[2],
                                                                 CONCAT11(tip_init.
                                                  super_base_blob<256U>.m_data._M_elems[1],
                                                  tip_init.super_base_blob<256U>.m_data._M_elems[0])
                                                  ))))));
      peVar3 = (element_type *)
               CONCAT17(tip_init.super_base_blob<256U>.m_data._M_elems[0xf],
                        CONCAT16(tip_init.super_base_blob<256U>.m_data._M_elems[0xe],
                                 CONCAT15(tip_init.super_base_blob<256U>.m_data._M_elems[0xd],
                                          CONCAT14(tip_init.super_base_blob<256U>.m_data._M_elems
                                                   [0xc],CONCAT13(tip_init.super_base_blob<256U>.
                                                                  m_data._M_elems[0xb],
                                                                  CONCAT12(tip_init.
                                                  super_base_blob<256U>.m_data._M_elems[10],
                                                  CONCAT11(tip_init.super_base_blob<256U>.m_data.
                                                           _M_elems[9],
                                                           tip_init.super_base_blob<256U>.m_data.
                                                           _M_elems[8])))))));
      bVar9 = (element_type *)local_278._8_8_ != (element_type *)0x0;
      local_278._8_8_ = peVar3;
      if (bVar9) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
      }
      local_308 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
      ;
      local_300 = "";
      local_318 = &boost::unit_test::basic_cstring<char_const>::null;
      local_310 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x101;
      file_02.m_begin = (iterator)&local_308;
      msg_02.m_end = pvVar17;
      msg_02.m_begin = pvVar16;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_318,
                 msg_02);
      local_328.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_278._0_8_;
      local_328.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_;
      if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_278._8_8_ + 8) = *(_Atomic_word *)(local_278._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_278._8_8_ + 8) = *(_Atomic_word *)(local_278._8_8_ + 8) + 1;
        }
      }
      puVar12 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                          (val,
                           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
                           ,0xe6,"operator()","m_node.chainman");
      _cVar23 = 0x753b35;
      tip_init.super_base_blob<256U>.m_data._M_elems[0] =
           ChainstateManager::ProcessNewBlock
                     ((puVar12->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&local_328,
                      true,true,&ignored);
      tip_init.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_98._0_8_ = "ProcessBlock(last_mined)";
      local_98._8_8_ = "";
      sStack_c0.px = (element_type *)(sStack_c0._1_8_ << 8);
      local_c8._M_head_impl = (_Impl *)&PTR__lazy_ostream_013ae1c8;
      sStack_c0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      aStack_b0._M_allocated_capacity = (size_type)local_98;
      local_338 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
      ;
      local_330 = "";
      pvVar16 = (iterator)0x2;
      pvVar17 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&tip_init,(lazy_ostream *)&local_c8,2,0,WARN,_cVar23,
                 (size_t)&local_338,0x101);
      boost::detail::shared_count::~shared_count
                ((shared_count *)(tip_init.super_base_blob<256U>.m_data._M_elems + 0x10));
      if ((element_type *)
          local_328.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_328.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&mtx.vout);
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&mtx.vin);
      uVar18 = uVar18 - 1;
    } while (1 < uVar18);
    uVar18 = 0x65;
    do {
      CBlockHeader::GetHash((uint256 *)&mtx,(CBlockHeader *)local_278._0_8_);
      MinerTestingSetup::GoodBlock((MinerTestingSetup *)&local_c8,(uint256 *)this);
      uVar7 = local_278._8_8_;
      local_278._0_8_ = local_c8._M_head_impl;
      local_278._8_8_ = sStack_c0.px;
      if ((element_type *)uVar7 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
      }
      local_348 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
      ;
      local_340 = "";
      local_358 = &boost::unit_test::basic_cstring<char_const>::null;
      local_350 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x107;
      file_03.m_begin = (iterator)&local_348;
      msg_03.m_end = pvVar17;
      msg_03.m_begin = pvVar16;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_358,
                 msg_03);
      local_368.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_278._0_8_;
      local_368.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_;
      if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_278._8_8_ + 8) = *(_Atomic_word *)(local_278._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_278._8_8_ + 8) = *(_Atomic_word *)(local_278._8_8_ + 8) + 1;
        }
      }
      puVar12 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                          (val,
                           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
                           ,0xe6,"operator()","m_node.chainman");
      _cVar23 = 0x753d53;
      bVar9 = ChainstateManager::ProcessNewBlock
                        ((puVar12->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&local_368,
                         true,true,&ignored);
      local_c8._M_head_impl._0_1_ = (readonly_property<bool>)(readonly_property<bool>)bVar9;
      sStack_c0.px = (element_type *)0x0;
      sStack_c0.pn.pi_ = (sp_counted_base *)0x0;
      tip_init.super_base_blob<256U>.m_data._M_elems[0] = '2';
      tip_init.super_base_blob<256U>.m_data._M_elems[1] = 0xc5;
      tip_init.super_base_blob<256U>.m_data._M_elems[2] = 0xf7;
      tip_init.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[8] = 'J';
      tip_init.super_base_blob<256U>.m_data._M_elems[9] = 0xc5;
      tip_init.super_base_blob<256U>.m_data._M_elems[10] = 0xf7;
      tip_init.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      tip_init.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_1_ = 0;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&PTR__lazy_ostream_013ae1c8;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&tip_init;
      local_378 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
      ;
      local_370 = "";
      pvVar16 = (iterator)0x2;
      pvVar17 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_c8,(lazy_ostream *)&mtx,2,0,WARN,_cVar23,
                 (size_t)&local_378,0x107);
      boost::detail::shared_count::~shared_count(&sStack_c0.pn);
      if ((element_type *)
          local_368.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_368.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar18 = uVar18 - 1;
    } while (1 < uVar18);
    CBlockHeader::GetHash(&tip_init,(CBlockHeader *)local_278._0_8_);
    reorg.
    super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    reorg.
    super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    reorg.
    super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MinerTestingSetup::GoodBlock((MinerTestingSetup *)&mtx,(uint256 *)this);
    uVar7 = local_278._8_8_;
    local_278._0_8_ =
         mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
         _M_start;
    bVar9 = (element_type *)local_278._8_8_ != (element_type *)0x0;
    local_278._8_8_ =
         (element_type *)
         CONCAT71(mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_finish._1_7_,
                  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_finish._0_1_);
    if (bVar9) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
    }
    std::vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>::
    push_back(&reorg,(value_type *)local_278);
    for (lVar14 = ((long)txs.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)txs.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) + 0x65; lVar14 != 0;
        lVar14 = lVar14 + -1) {
      CBlockHeader::GetHash((uint256 *)&mtx,(CBlockHeader *)local_278._0_8_);
      MinerTestingSetup::GoodBlock((MinerTestingSetup *)&local_c8,(uint256 *)this);
      uVar7 = local_278._8_8_;
      local_278._0_8_ = local_c8._M_head_impl;
      local_278._8_8_ = sStack_c0.px;
      if ((element_type *)uVar7 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7);
      }
      std::vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>::
      push_back(&reorg,(value_type *)local_278);
    }
    criticalblock17.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
    auVar4[0xf] = 0;
    auVar4._0_15_ = stack0xfffffffffffffe41;
    stack0xfffffffffffffe40 = (shared_ptr<boost::basic_wrap_stringstream<char>_>)(auVar4 << 8);
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock17.super_unique_lock);
    psVar6 = txs.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (tx = txs.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start; tx != psVar6; tx = tx + 1) {
      ChainstateManager::ProcessTransaction
                ((MempoolAcceptResult *)&mtx,
                 (val->_M_t).
                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,tx,false);
      local_3a8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
      ;
      local_3a0 = "";
      local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar23 = 0x753feb;
      file_04.m_end = (iterator)0x11a;
      file_04.m_begin = (iterator)&local_3a8;
      msg_04.m_end = pvVar17;
      msg_04.m_begin = pvVar16;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3b8,
                 msg_04);
      local_98[0] = (readonly_property<bool>)
                    (readonly_property<bool>)
                    ((int)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                          super__Vector_impl_data._M_start == 0);
      stack0xffffffffffffff70 = (undefined1  [16])0x0;
      local_1e8.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)
                     "parent2_v2_result.m_result_type == MempoolAcceptResult::ResultType::VALID" +
                    0xb);
      local_1e8.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf6dbeb;
      sStack_c0.px = (element_type *)(sStack_c0._1_8_ << 8);
      local_c8._M_head_impl = (_Impl *)&PTR__lazy_ostream_013ae1c8;
      sStack_c0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      aStack_b0._M_allocated_capacity = (size_type)&local_1e8;
      local_3c8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
      ;
      local_3c0 = "";
      pvVar16 = (iterator)0x2;
      pvVar17 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_98,(lazy_ostream *)&local_c8,2,0,WARN,_cVar23,
                 (size_t)&local_3c8,0x11a);
      boost::detail::shared_count::~shared_count(local_88);
      if ((local_f8 == true) &&
         (local_f8 = false,
         local_110._M_value.
         super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
         ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
        operator_delete(local_110._M_value.
                        super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_110._M_value.
                              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage - local_110._0_8_);
      }
      std::__cxx11::
      _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::_M_clear(local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)mtx._48_8_ != &local_168) {
        operator_delete((void *)mtx._48_8_,local_168._M_allocated_capacity + 1);
      }
      if (mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage !=
          (pointer)&mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        operator_delete(mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        (ulong)((long)&(mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>
                                        ._M_impl.super__Vector_impl_data._M_finish)->nValue + 1));
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock17.super_unique_lock);
    local_3d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
    ;
    local_3d0 = "";
    local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x120;
    file_05.m_begin = (iterator)&local_3d8;
    msg_05.m_end = pvVar17;
    msg_05.m_begin = pvVar16;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3e8,
               msg_05);
    local_98._8_8_ = local_98._9_8_ << 8;
    local_98._0_8_ = &PTR__lazy_ostream_013ae088;
    local_88[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_88[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_218 = (undefined1  [8])
                CTxMemPool::size((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_RegTestingSetup.
                                 super_TestingSetup.super_ChainTestingSetup.super_BasicTestingSetup.
                                 m_node.mempool._M_t.
                                 super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>
                                 .super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
    local_220._M_t.super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
    super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl =
         (tuple<PeerManager_*,_std::default_delete<PeerManager>_>)
         ((long)txs.
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)txs.
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4);
    criticalblock17.super_unique_lock._M_device =
         (mutex_type *)
         CONCAT71(criticalblock17.super_unique_lock._M_device._1_7_,
                  (tuple<PeerManager_*,_std::default_delete<PeerManager>_>)local_218 ==
                  (_Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>)
                  local_220._M_t.
                  super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
                  super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl);
    criticalblock17.super_unique_lock._8_8_ = (element_type *)0x0;
    sStack_1b8.pi_ = (sp_counted_base *)0x0;
    local_1e8.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0xf7c21b;
    local_1e8.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0xf7c283;
    local_200._0_8_ = local_218;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_1_ = 0;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_013ae0c8;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_200;
    local_210._0_8_ = &local_220;
    sStack_c0.px = (element_type *)(sStack_c0._1_8_ << 8);
    local_c8._M_head_impl = (_Impl *)&PTR__lazy_ostream_013ae0c8;
    sStack_c0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    aStack_b0._M_allocated_capacity = (size_type)local_210;
    new_block = (bool *)0x1;
    pvVar16 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&criticalblock17,(lazy_ostream *)local_98,1,2,REQUIRE,0xf6ce30,
               (size_t)&local_1e8,0x120,&mtx,"txs.size()",(COutPoint *)&local_c8);
    boost::detail::shared_count::~shared_count(&sStack_1b8);
    rpc_thread._M_id._M_thread = (id)0;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)operator_new(0x20);
    *(undefined ***)
     ((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
         &PTR___State_013b3a28;
    *(mempool_locks_reorg **)
     (((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) = this;
    *(vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      **)(((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data.
          _M_elems + 0x10) = &txs;
    *(uint256 **)
     (((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
       _M_start)->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = &tip_init;
    std::thread::_M_start_thread(&rpc_thread,&mtx,0);
    if (mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      (**(code **)(*(long *)((mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                              super__Vector_impl_data._M_start)->prevout).hash.m_wrapped.
                            super_base_blob<256U>.m_data._M_elems + 8))();
    }
    psVar5 = reorg.
             super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar15 = reorg.
                   super__Vector_base<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar15 != psVar5;
        psVar15 = psVar15 + 1) {
      local_400.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar15->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_400.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (psVar15->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
      ;
      if (local_400.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_400.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_400.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_400.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
          ->_M_use_count =
               (local_400.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      puVar12 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                          (val,
                           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
                           ,0xe6,"operator()","m_node.chainman");
      new_block = &ignored;
      ChainstateManager::ProcessNewBlock
                ((puVar12->_M_t).
                 super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                 .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&local_400,true,
                 true,new_block);
      if (local_400.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_400.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    local_410 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
    ;
    local_408 = "";
    local_420 = &boost::unit_test::basic_cstring<char_const>::null;
    local_418 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x141;
    file_06.m_begin = (iterator)&local_410;
    msg_06.m_end = pvVar16;
    msg_06.m_begin = new_block;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_420,
               msg_06);
    local_98._8_8_ = local_98._9_8_ << 8;
    local_98._0_8_ = &PTR__lazy_ostream_013ae088;
    local_88[0].pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_88[1].pi_ = (sp_counted_base *)((long)"\x05\x04\x03\x02\x01" + 5);
    CBlockHeader::GetHash((uint256 *)&criticalblock17,(CBlockHeader *)local_278._0_8_);
    inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
              (val,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
               ,0x141,"test_method","m_node.chainman");
    inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
              (val,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
               ,0x141,"operator()","m_node.chainman");
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&cs_main;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_1_ = 0;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&mtx);
    pCVar13 = ChainstateManager::ActiveChainstate
                        ((val->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    puVar2 = (pCVar13->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]->phashBlock;
    if (puVar2 == (uint256 *)0x0) break;
    local_1e8.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         *(pointer *)(puVar2->super_base_blob<256U>).m_data._M_elems;
    local_1e8.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         *(pointer *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
    local_1e8.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         *(pointer *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
    uStack_1d0 = *(pointer *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
    std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&mtx);
    auVar22[0] = -((uchar)sStack_1b8.pi_ ==
                  (uchar)local_1e8.
                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    auVar22[1] = -(sStack_1b8.pi_._1_1_ ==
                  local_1e8.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_);
    auVar22[2] = -(sStack_1b8.pi_._2_1_ ==
                  local_1e8.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_);
    auVar22[3] = -(sStack_1b8.pi_._3_1_ ==
                  local_1e8.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_);
    auVar22[4] = -(sStack_1b8.pi_._4_1_ ==
                  local_1e8.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_);
    auVar22[5] = -(sStack_1b8.pi_._5_1_ ==
                  local_1e8.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_);
    auVar22[6] = -(sStack_1b8.pi_._6_1_ ==
                  local_1e8.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_);
    auVar22[7] = -(sStack_1b8.pi_._7_1_ ==
                  local_1e8.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_);
    auVar22[8] = -(auStack_1b0[0] == (char)uStack_1d0);
    auVar22[9] = -(auStack_1b0[1] == uStack_1d0._1_1_);
    auVar22[10] = -(auStack_1b0[2] == uStack_1d0._2_1_);
    auVar22[0xb] = -(auStack_1b0[3] == uStack_1d0._3_1_);
    auVar22[0xc] = -(auStack_1b0[4] == uStack_1d0._4_1_);
    auVar22[0xd] = -(auStack_1b0[5] == uStack_1d0._5_1_);
    auVar22[0xe] = -(auStack_1b0[6] == uStack_1d0._6_1_);
    auVar22[0xf] = -(auStack_1b0[7] == uStack_1d0._7_1_);
    auVar20[0] = -((char)criticalblock17.super_unique_lock._M_device ==
                  local_1e8.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._0_1_);
    auVar20[1] = -(criticalblock17.super_unique_lock._M_device._1_1_ ==
                  local_1e8.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._1_1_);
    auVar20[2] = -(criticalblock17.super_unique_lock._M_device._2_1_ ==
                  local_1e8.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._2_1_);
    auVar20[3] = -(criticalblock17.super_unique_lock._M_device._3_1_ ==
                  local_1e8.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._3_1_);
    auVar20[4] = -(criticalblock17.super_unique_lock._M_device._4_1_ ==
                  local_1e8.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._4_1_);
    auVar20[5] = -(criticalblock17.super_unique_lock._M_device._5_1_ ==
                  local_1e8.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._5_1_);
    auVar20[6] = -(criticalblock17.super_unique_lock._M_device._6_1_ ==
                  local_1e8.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._6_1_);
    auVar20[7] = -(criticalblock17.super_unique_lock._M_device._7_1_ ==
                  local_1e8.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_start._7_1_);
    auVar20[8] = -(criticalblock17.super_unique_lock._M_owns ==
                  (bool)local_1e8.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish._0_1_);
    auVar20[9] = -(criticalblock17.super_unique_lock._9_1_ ==
                  local_1e8.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_1_);
    auVar20[10] = -(criticalblock17.super_unique_lock._10_1_ ==
                   local_1e8.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._2_1_);
    auVar20[0xb] = -(criticalblock17.super_unique_lock._11_1_ ==
                    local_1e8.
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish._3_1_);
    auVar20[0xc] = -(criticalblock17.super_unique_lock._12_1_ ==
                    local_1e8.
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish._4_1_);
    auVar20[0xd] = -(criticalblock17.super_unique_lock._13_1_ ==
                    local_1e8.
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish._5_1_);
    auVar20[0xe] = -(criticalblock17.super_unique_lock._14_1_ ==
                    local_1e8.
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish._6_1_);
    auVar20[0xf] = -(criticalblock17.super_unique_lock._15_1_ ==
                    local_1e8.
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish._7_1_);
    auVar20 = auVar20 & auVar22;
    local_200[0] = (ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff;
    local_200._8_16_ = (undefined1  [16])0x0;
    local_210._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
    ;
    local_210._8_8_ =
         (long)
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp"
         + 0x68;
    local_218 = (undefined1  [8])&criticalblock17;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish._0_1_ = 0;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&PTR__lazy_ostream_013aed38;
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
    mtx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_218;
    local_220._M_t.super__Tuple_impl<0UL,_PeerManager_*,_std::default_delete<PeerManager>_>.
    super__Head_base<0UL,_PeerManager_*,_false>._M_head_impl =
         (tuple<PeerManager_*,_std::default_delete<PeerManager>_>)&local_1e8;
    sStack_c0.px = (element_type *)(sStack_c0._1_8_ << 8);
    local_c8._M_head_impl = (_Impl *)&PTR__lazy_ostream_013aed38;
    sStack_c0.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    aStack_b0._M_allocated_capacity = (size_type)&local_220;
    pvVar16 = (iterator)0x1;
    pvVar17 = (iterator)0x2;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_200,(lazy_ostream *)local_98,1,2,REQUIRE,0xf7c54b,
               (size_t)local_210,0x141,&mtx,
               "(MaybeCheckNotHeld(inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\", 321, __func__, \"m_node.chainman\")->GetMutex()), [&]() -> decltype(auto) { UniqueLock criticalblock20(MaybeCheckNotHeld(inline_assertion_check<true>(m_node.chainman, \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\", 321, __func__, \"m_node.chainman\")->GetMutex()), \"inline_assertion_check<true>(m_node.chainman, \\\"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\\\", 321, __func__, \\\"m_node.chainman\\\")->GetMutex()\", \"/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_block_tests.cpp\", 321); return m_node.chainman->ActiveChain().Tip()->GetBlockHash(); }())"
               ,(COutPoint *)&local_c8);
    boost::detail::shared_count::~shared_count((shared_count *)(local_200 + 0x10));
    std::thread::join();
    if (rpc_thread._M_id._M_thread != 0) {
      std::terminate();
    }
    std::vector<std::shared_ptr<const_CBlock>,_std::allocator<std::shared_ptr<const_CBlock>_>_>::
    ~vector(&reorg);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&txs);
    bVar9 = uVar10 < 2;
    uVar10 = uVar10 - 1;
    if (bVar9) {
      if ((element_type *)local_278._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._8_8_);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
  }
  __assert_fail("phashBlock != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h",
                0xf5,"uint256 CBlockIndex::GetBlockHash() const");
}

Assistant:

BOOST_AUTO_TEST_CASE(mempool_locks_reorg)
{
    bool ignored;
    auto ProcessBlock = [&](std::shared_ptr<const CBlock> block) -> bool {
        return Assert(m_node.chainman)->ProcessNewBlock(block, /*force_processing=*/true, /*min_pow_checked=*/true, /*new_block=*/&ignored);
    };

    // Process all mined blocks
    BOOST_REQUIRE(ProcessBlock(std::make_shared<CBlock>(Params().GenesisBlock())));
    auto last_mined = GoodBlock(Params().GenesisBlock().GetHash());
    BOOST_REQUIRE(ProcessBlock(last_mined));

    // Run the test multiple times
    for (int test_runs = 3; test_runs > 0; --test_runs) {
        BOOST_CHECK_EQUAL(last_mined->GetHash(), WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip()->GetBlockHash()));

        // Later on split from here
        const uint256 split_hash{last_mined->hashPrevBlock};

        // Create a bunch of transactions to spend the miner rewards of the
        // most recent blocks
        std::vector<CTransactionRef> txs;
        for (int num_txs = 22; num_txs > 0; --num_txs) {
            CMutableTransaction mtx;
            mtx.vin.emplace_back(COutPoint{last_mined->vtx[0]->GetHash(), 1}, CScript{});
            mtx.vin[0].scriptWitness.stack.push_back(WITNESS_STACK_ELEM_OP_TRUE);
            mtx.vout.push_back(last_mined->vtx[0]->vout[1]);
            mtx.vout[0].nValue -= 1000;
            txs.push_back(MakeTransactionRef(mtx));

            last_mined = GoodBlock(last_mined->GetHash());
            BOOST_REQUIRE(ProcessBlock(last_mined));
        }

        // Mature the inputs of the txs
        for (int j = COINBASE_MATURITY; j > 0; --j) {
            last_mined = GoodBlock(last_mined->GetHash());
            BOOST_REQUIRE(ProcessBlock(last_mined));
        }

        // Mine a reorg (and hold it back) before adding the txs to the mempool
        const uint256 tip_init{last_mined->GetHash()};

        std::vector<std::shared_ptr<const CBlock>> reorg;
        last_mined = GoodBlock(split_hash);
        reorg.push_back(last_mined);
        for (size_t j = COINBASE_MATURITY + txs.size() + 1; j > 0; --j) {
            last_mined = GoodBlock(last_mined->GetHash());
            reorg.push_back(last_mined);
        }

        // Add the txs to the tx pool
        {
            LOCK(cs_main);
            for (const auto& tx : txs) {
                const MempoolAcceptResult result = m_node.chainman->ProcessTransaction(tx);
                BOOST_REQUIRE(result.m_result_type == MempoolAcceptResult::ResultType::VALID);
            }
        }

        // Check that all txs are in the pool
        {
            BOOST_CHECK_EQUAL(m_node.mempool->size(), txs.size());
        }

        // Run a thread that simulates an RPC caller that is polling while
        // validation is doing a reorg
        std::thread rpc_thread{[&]() {
            // This thread is checking that the mempool either contains all of
            // the transactions invalidated by the reorg, or none of them, and
            // not some intermediate amount.
            while (true) {
                LOCK(m_node.mempool->cs);
                if (m_node.mempool->size() == 0) {
                    // We are done with the reorg
                    break;
                }
                // Internally, we might be in the middle of the reorg, but
                // externally the reorg to the most-proof-of-work chain should
                // be atomic. So the caller assumes that the returned mempool
                // is consistent. That is, it has all txs that were there
                // before the reorg.
                assert(m_node.mempool->size() == txs.size());
                continue;
            }
            LOCK(cs_main);
            // We are done with the reorg, so the tip must have changed
            assert(tip_init != m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }};

        // Submit the reorg in this thread to invalidate and remove the txs from the tx pool
        for (const auto& b : reorg) {
            ProcessBlock(b);
        }
        // Check that the reorg was eventually successful
        BOOST_CHECK_EQUAL(last_mined->GetHash(), WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip()->GetBlockHash()));

        // We can join the other thread, which returns when the reorg was successful
        rpc_thread.join();
    }
}